

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool duckdb::BitpackingAnalyze<unsigned_char>(AnalyzeState *state,Vector *input,idx_t count)

{
  LogicalType *this;
  ulong uVar1;
  idx_t iVar2;
  ulong in_RDX;
  Vector *in_RSI;
  UnifiedVectorFormat *in_RDI;
  Vector *unaff_retaddr;
  idx_t idx;
  idx_t i;
  uchar *data;
  UnifiedVectorFormat vdata;
  idx_t type_size;
  BitpackingAnalyzeState<unsigned_char> *analyze_state;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  uchar in_stack_ffffffffffffff37;
  BitpackingState<unsigned_char,_signed_char> *this_00;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  ulong local_98;
  PhysicalType in_stack_ffffffffffffff7f;
  UnifiedVectorFormat local_78;
  idx_t local_30;
  BitpackingAnalyzeState<unsigned_char> *local_28;
  ulong local_20;
  Vector *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = AnalyzeState::Cast<duckdb::BitpackingAnalyzeState<unsigned_char>>
                       ((AnalyzeState *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  this = Vector::GetType(local_18);
  LogicalType::InternalType(this);
  local_30 = GetTypeIdSize(in_stack_ffffffffffffff7f);
  uVar1 = local_30 << 0xc;
  iVar2 = CompressionInfo::GetBlockSize((CompressionInfo *)0xa87e9e);
  if (iVar2 < uVar1) {
    bVar3 = 0;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    Vector::ToUnifiedFormat
              (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
    UnifiedVectorFormat::GetData<unsigned_char>(&local_78);
    for (local_98 = 0; local_98 < local_20; local_98 = local_98 + 1) {
      SelectionVector::get_index(local_78.sel,local_98);
      this_00 = &local_28->state;
      TemplatedValidityMask<unsigned_long>::RowIsValid
                ((TemplatedValidityMask<unsigned_long> *)this_00,
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
      in_stack_ffffffffffffff37 =
           BitpackingState<unsigned_char,_signed_char>::Update<duckdb::EmptyBitpackingWriter>
                     (this_00,in_stack_ffffffffffffff37,(bool)in_stack_ffffffffffffff36);
      if (!(bool)in_stack_ffffffffffffff37) {
        bVar3 = 0;
        goto LAB_00a87fd0;
      }
    }
    bVar3 = 1;
LAB_00a87fd0:
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool BitpackingAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = state.Cast<BitpackingAnalyzeState<T>>();

	// We use BITPACKING_METADATA_GROUP_SIZE tuples, which can exceed the block size.
	// In that case, we disable bitpacking.
	// we are conservative here by multiplying by 2
	auto type_size = GetTypeIdSize(input.GetType().InternalType());
	if (type_size * BITPACKING_METADATA_GROUP_SIZE * 2 > state.info.GetBlockSize()) {
		return false;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!analyze_state.state.template Update<EmptyBitpackingWriter>(data[idx], vdata.validity.RowIsValid(idx))) {
			return false;
		}
	}
	return true;
}